

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O2

bool anon_unknown.dwarf_235e13::compare
               (FrameBuffer *asRead,FrameBuffer *asWritten,Box2i *dataWindow,bool nonfatal)

{
  _Rb_tree_color _Var1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_node_base *p_Var4;
  long lVar5;
  long lVar6;
  float *pfVar7;
  ostream *poVar8;
  ConstIterator tmp;
  long lVar9;
  Box2i *pBVar10;
  long lVar11;
  half hVar12;
  half hVar13;
  half local_56;
  half local_54;
  half local_52;
  Box2i *local_50;
  FrameBuffer *local_48;
  _Rb_tree_node_base *local_40;
  FrameBuffer *local_38;
  
  local_50 = dataWindow;
  local_48 = asWritten;
  local_38 = asRead;
  p_Var3 = (_Rb_tree_node_base *)Imf_3_4::FrameBuffer::begin();
  do {
    p_Var4 = (_Rb_tree_node_base *)Imf_3_4::FrameBuffer::end();
    if (p_Var3 == p_Var4) {
      return SUB81(p_Var4,0);
    }
    local_40 = p_Var3 + 1;
    lVar5 = Imf_3_4::FrameBuffer::find((char *)local_48);
    pBVar10 = local_50;
    for (lVar9 = (long)(local_50->min).y; lVar9 <= (pBVar10->max).y; lVar9 = lVar9 + 1) {
      for (lVar11 = (long)(pBVar10->min).x; lVar11 <= (pBVar10->max).x; lVar11 = lVar11 + 1) {
        _Var1 = p_Var3[9]._M_color;
        if (_Var1 != _S_red) {
          pfVar7 = (float *)((long)&(p_Var3[9]._M_parent)->_M_color +
                            (long)p_Var3[9]._M_left * lVar11 + (long)p_Var3[9]._M_right * lVar9);
          if (_Var1 == _S_black) {
            hVar12._h = *(uint16_t *)pfVar7;
          }
          else {
            if (_Var1 != 2) goto LAB_00176d8e;
            if ((-(int)pfVar7 & 3U) != 0) {
              __assert_fail("alignToFour (ptr) == ptr",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testOptimizedInterleavePatterns.cpp"
                            ,0xe0,
                            "bool (anonymous namespace)::compare(const FrameBuffer &, const FrameBuffer &, const Box2i &, bool)"
                           );
            }
            Imath_3_2::half::half(&local_52,*pfVar7);
            hVar12._h = local_52._h;
          }
          lVar6 = Imf_3_4::FrameBuffer::end();
          if (lVar5 == lVar6) {
            Imath_3_2::half::half(&local_56,(float)(double)p_Var3[10]._M_parent);
            hVar13._h = local_56._h;
          }
          else {
            iVar2 = *(int *)(lVar5 + 0x120);
            pBVar10 = local_50;
            if (iVar2 == 0) goto LAB_00176cb5;
            pfVar7 = (float *)(*(long *)(lVar5 + 0x130) * lVar11 +
                              *(long *)(lVar5 + 0x138) * lVar9 + *(long *)(lVar5 + 0x128));
            if (iVar2 == 1) {
              hVar13._h = *(uint16_t *)pfVar7;
            }
            else {
              if (iVar2 != 2) {
LAB_00176d8e:
                std::operator<<((ostream *)&std::cout,"don\'t know about that\n");
                exit(1);
              }
              if ((-(int)pfVar7 & 3U) != 0) {
                __assert_fail("alignToFour (ptr) == ptr",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testOptimizedInterleavePatterns.cpp"
                              ,0xf5,
                              "bool (anonymous namespace)::compare(const FrameBuffer &, const FrameBuffer &, const Box2i &, bool)"
                             );
              }
              Imath_3_2::half::half(&local_54,*pfVar7);
              hVar13._h = local_54._h;
            }
          }
          pBVar10 = local_50;
          if (hVar13._h != hVar12._h) {
            poVar8 = std::operator<<((ostream *)&std::cout,"\n\nerror reading back channel ");
            poVar8 = std::operator<<(poVar8,(char *)local_40);
            poVar8 = std::operator<<(poVar8," pixel ");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)lVar11);
            poVar8 = std::operator<<(poVar8,',');
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)lVar9);
            poVar8 = std::operator<<(poVar8," got ");
            poVar8 = (ostream *)::operator<<(poVar8,hVar12);
            poVar8 = std::operator<<(poVar8," expected ");
            poVar8 = (ostream *)::operator<<(poVar8,hVar13);
            std::endl<char,std::char_traits<char>>(poVar8);
            __assert_fail("writtenHalf.bits () == readHalf.bits ()",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testOptimizedInterleavePatterns.cpp"
                          ,0x109,
                          "bool (anonymous namespace)::compare(const FrameBuffer &, const FrameBuffer &, const Box2i &, bool)"
                         );
          }
        }
LAB_00176cb5:
      }
    }
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

bool
compare (
    const FrameBuffer& asRead,
    const FrameBuffer& asWritten,
    const Box2i&       dataWindow,
    bool               nonfatal)
{
    for (FrameBuffer::ConstIterator i = asRead.begin (); i != asRead.end ();
         i++)
    {
        FrameBuffer::ConstIterator p = asWritten.find (i.name ());
        for (int y = dataWindow.min.y; y <= dataWindow.max.y; y++)
        {
            for (int x = dataWindow.min.x; x <= dataWindow.max.x; x++)

            {
                //
                // extract value read back from file
                //
                intptr_t base = reinterpret_cast<intptr_t> (i.slice ().base);
                char*    ptr  = reinterpret_cast<char*> (
                    base + i.slice ().yStride * intptr_t (y) +
                    i.slice ().xStride * intptr_t (x));
                half readHalf;
                switch (i.slice ().type)
                {
                    case IMF::FLOAT:
                        assert (alignToFour (ptr) == ptr);
                        readHalf = half (*(float*) ptr);
                        break;
                    case IMF::HALF: readHalf = half (*(half*) ptr); break;
                    case IMF::UINT: continue; // can't very well check this
                    default: cout << "don't know about that\n"; exit (1);
                }

                half writtenHalf;

                if (p != asWritten.end ())
                {

                    intptr_t base =
                        reinterpret_cast<intptr_t> (p.slice ().base);
                    char* ptr = reinterpret_cast<char*> (
                        base + p.slice ().yStride * intptr_t (y) +
                        p.slice ().xStride * intptr_t (x));
                    switch (p.slice ().type)
                    {
                        case IMF::FLOAT:
                            assert (alignToFour (ptr) == ptr);
                            writtenHalf = half (*(float*) ptr);
                            break;
                        case IMF::HALF:
                            writtenHalf = half (*(half*) ptr);
                            break;
                        case IMF::UINT: continue;
                        default: cout << "don't know about that\n"; exit (1);
                    }
                }
                else { writtenHalf = half (i.slice ().fillValue); }

                if (writtenHalf.bits () != readHalf.bits ())
                {
                    if (nonfatal) { return false; }
                    else
                    {
                        cout << "\n\nerror reading back channel " << i.name ()
                             << " pixel " << x << ',' << y << " got "
                             << readHalf << " expected " << writtenHalf << endl;
                        assert (writtenHalf.bits () == readHalf.bits ());
                        exit (1);
                    }
                }
            }
        }
    }
    return true;
}